

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long in_RDI;
  U32 mls;
  size_t in_stack_00000110;
  void *in_stack_00000118;
  U32 *in_stack_00000120;
  seqStore_t *in_stack_00000128;
  ZSTD_matchState_t *in_stack_00000130;
  size_t local_8;
  
  switch(*(undefined4 *)(in_RDI + 0x110)) {
  default:
    local_8 = ZSTD_compressBlock_doubleFast_dictMatchState_4
                        (in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_00000118,
                         in_stack_00000110);
    break;
  case 5:
    local_8 = ZSTD_compressBlock_doubleFast_dictMatchState_5
                        (in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_00000118,
                         in_stack_00000110);
    break;
  case 6:
    local_8 = ZSTD_compressBlock_doubleFast_dictMatchState_6
                        (in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_00000118,
                         in_stack_00000110);
    break;
  case 7:
    local_8 = ZSTD_compressBlock_doubleFast_dictMatchState_7
                        (in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_00000118,
                         in_stack_00000110);
  }
  return local_8;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_7(ms, seqStore, rep, src, srcSize);
    }
}